

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O1

int compute_all_mulw(uint16_t dst,target_long src1)

{
  uint uVar1;
  undefined6 in_register_0000003a;
  
  uVar1 = (uint)CONCAT62(in_register_0000003a,dst);
  return (uint)(src1 != 0) << 0xb | (uint)(uVar1 == 0) << 6 | uVar1 >> 8 & 0xffffff80 |
         (uint)(src1 != 0) | (uint)"\x04"[(ulong)dst & 0xff];
}

Assistant:

static int glue(compute_all_mul, SUFFIX)(DATA_TYPE dst, target_long src1)
{
    int cf, pf, af, zf, sf, of;

    cf = (src1 != 0);
    pf = parity_table[(uint8_t)dst];
    af = 0; /* undefined */
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = cf * CC_O;
    return cf | pf | af | zf | sf | of;
}